

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SeparatorEx(ImGuiSeparatorFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImDrawList *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 IVar7;
  long lVar8;
  ImGuiOldColumns *pIVar9;
  ImRect bb;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  ImRect local_48;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if ((flags & 2U) == 0) {
      if ((flags & 1U) != 0) {
        local_48.Max.x = (pIVar1->Pos).x;
        lVar8 = (long)(pIVar5->GroupStack).Size;
        local_48.Min.x = local_48.Max.x;
        if ((0 < lVar8) && ((pIVar5->GroupStack).Data[lVar8 + -1].WindowID == pIVar1->ID)) {
          local_48.Min.x = (pIVar1->DC).Indent.x + local_48.Max.x;
        }
        pIVar2 = pIVar5->CurrentTable;
        if (pIVar2 == (ImGuiTable *)0x0) {
          local_48.Max.x = local_48.Max.x + (pIVar1->Size).x;
        }
        else {
          pIVar3 = (pIVar2->Columns).Data;
          local_48.Min.x = pIVar3[pIVar2->CurrentColumn].MinX;
          local_48.Max.x = pIVar3[pIVar2->CurrentColumn].MaxX;
        }
        if ((flags & 4U) == 0) {
          pIVar9 = (ImGuiOldColumns *)0x0;
        }
        else {
          pIVar9 = (pIVar1->DC).CurrentColumns;
        }
        if (pIVar9 != (ImGuiOldColumns *)0x0) {
          local_50 = local_48.Min.x;
          local_4c = local_48.Max.x;
          PushColumnsBackground();
          local_48.Max.x = local_4c;
          local_48.Min.x = local_50;
        }
        local_48.Min.y = (pIVar1->DC).CursorPos.y;
        local_48.Max.y = local_48.Min.y + 1.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ItemSize(&local_58,-1.0);
        bVar6 = ItemAdd(&local_48,0,(ImRect *)0x0,0);
        if (bVar6) {
          pIVar4 = pIVar1->DrawList;
          local_58.y = local_48.Min.y;
          local_58.x = local_48.Max.x;
          IVar7 = GetColorU32(0x1b,1.0);
          ImDrawList::AddLine(pIVar4,&local_48.Min,&local_58,IVar7,1.0);
          if (pIVar5->LogEnabled == true) {
            LogRenderedText(&local_48.Min,"--------------------------------\n",(char *)0x0);
          }
        }
        if (pIVar9 != (ImGuiOldColumns *)0x0) {
          PopColumnsBackground();
          pIVar9->LineMinY = (pIVar1->DC).CursorPos.y;
        }
      }
    }
    else {
      local_48.Min.x = (pIVar1->DC).CursorPos.x;
      local_48.Min.y = (pIVar1->DC).CursorPos.y;
      local_48.Max.x = local_48.Min.x + 1.0;
      local_48.Max.y = (pIVar1->DC).CurrLineSize.y + local_48.Min.y;
      local_58.x = 0.0;
      local_58.y = 0.0;
      ItemSize(&local_58,-1.0);
      bVar6 = ItemAdd(&local_48,0,(ImRect *)0x0,0);
      if (bVar6) {
        pIVar4 = pIVar1->DrawList;
        local_58.y = local_48.Min.y;
        local_58.x = local_48.Min.x;
        local_38.x = local_48.Min.x;
        local_38.y = local_48.Max.y;
        IVar7 = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(pIVar4,&local_58,&local_38,IVar7,1.0);
        if (pIVar5->LogEnabled == true) {
          LogText(" |");
        }
      }
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}